

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O1

bool ghc::filesystem::copy_file(path *from,path *to,copy_options options,error_code *ec)

{
  bool bVar1;
  int iVar2;
  int __fd;
  undefined8 uVar3;
  file_time_type fVar4;
  file_time_type fVar5;
  int *piVar6;
  void *__s;
  size_t __n;
  ssize_t sVar7;
  long lVar8;
  file_status sf;
  error_code tect;
  file_status st;
  error_code tecf;
  path local_60;
  file_status local_40;
  error_category *peStack_38;
  
  local_40._type = none;
  uVar3 = std::_V2::system_category();
  local_60._path._M_string_length._0_4_ = 0;
  local_60._path.field_2._M_allocated_capacity = uVar3;
  peStack_38 = (error_category *)uVar3;
  detail::status_ex(&local_60,(error_code *)from,&local_40,(uintmax_t *)0x0,(uintmax_t *)0x0,
                    (time_t *)0x0,0);
  detail::status_ex((path *)((long)&local_60._path.field_2 + 8),(error_code *)to,
                    (file_status *)&local_60._path._M_string_length,(uintmax_t *)0x0,
                    (uintmax_t *)0x0,(time_t *)0x0,0);
  ec->_M_value = 0;
  ec->_M_cat = (error_category *)uVar3;
  if ((int)local_60._path._M_dataplus._M_p != 2) {
    *(ulong *)ec = CONCAT44(local_40._4_4_,local_40._type);
    ec->_M_cat = peStack_38;
    return false;
  }
  if ((1 < (uint)local_60._path.field_2._8_4_) &&
     (((local_60._path.field_2._8_4_ != 2 ||
       (bVar1 = equivalent(from,to,ec),
       (options & (update_existing|overwrite_existing|skip_existing)) == none)) || (bVar1)))) {
    iVar2 = 0x11;
    if ((int)local_60._path._M_string_length != 0) {
      uVar3 = local_60._path.field_2._M_allocated_capacity;
      iVar2 = (int)local_60._path._M_string_length;
    }
    ec->_M_value = iVar2;
    *(undefined4 *)&ec->field_0x4 = local_60._path._M_string_length._4_4_;
LAB_0019d39b:
    ec->_M_cat = (error_category *)uVar3;
    return false;
  }
  if ((options & update_existing) != none && 1 < (uint)local_60._path.field_2._8_4_) {
    fVar4 = last_write_time(from,ec);
    if ((ec->_M_value != 0) || (fVar5 = last_write_time(to,ec), ec->_M_value != 0)) {
      piVar6 = __errno_location();
      ec->_M_value = *piVar6;
      goto LAB_0019d39b;
    }
    if ((long)fVar4.__d.__r <= (long)fVar5.__d.__r) {
      return false;
    }
  }
  __s = operator_new(0x4000);
  memset(__s,0,0x4000);
  iVar2 = open((from->_path)._M_dataplus._M_p,0);
  if (iVar2 < 0) {
    piVar6 = __errno_location();
    ec->_M_value = *piVar6;
    ec->_M_cat = (error_category *)uVar3;
  }
  else {
    __fd = open((to->_path)._M_dataplus._M_p,
                (uint)((uint)local_60._path.field_2._8_4_ < 2) << 7 | 0x241,
                (ulong)(local_60._path._M_dataplus._M_p._4_2_ & 0x1ff));
    if (-1 < __fd) {
      while( true ) {
        __n = read(iVar2,__s,0x4000);
        bVar1 = (long)__n < 1;
        if ((long)__n < 1) break;
        lVar8 = 0;
        do {
          sVar7 = write(__fd,(void *)((long)__s + lVar8),__n);
          if (sVar7 < 1) {
            if (sVar7 < 0) {
              piVar6 = __errno_location();
              ec->_M_value = *piVar6;
              ec->_M_cat = (error_category *)uVar3;
              close(iVar2);
              close(__fd);
              goto LAB_0019d4c1;
            }
          }
          else {
            __n = __n - sVar7;
            lVar8 = lVar8 + sVar7;
          }
        } while (__n != 0);
      }
      close(iVar2);
      bVar1 = true;
      close(__fd);
      goto LAB_0019d4c1;
    }
    piVar6 = __errno_location();
    ec->_M_value = *piVar6;
    ec->_M_cat = (error_category *)uVar3;
    close(iVar2);
  }
  bVar1 = false;
LAB_0019d4c1:
  operator_delete(__s,0x4000);
  return bVar1;
}

Assistant:

GHC_INLINE bool copy_file(const path& from, const path& to, copy_options options, std::error_code& ec) noexcept
{
    std::error_code tecf, tect;
    auto sf = status(from, tecf);
    auto st = status(to, tect);
    bool overwrite = false;
    ec.clear();
    if (!is_regular_file(sf)) {
        ec = tecf;
        return false;
    }
    if (exists(st) && (!is_regular_file(st) || equivalent(from, to, ec) || (options & (copy_options::skip_existing | copy_options::overwrite_existing | copy_options::update_existing)) == copy_options::none)) {
        ec = tect ? tect : detail::make_error_code(detail::portable_error::exists);
        return false;
    }
    if (exists(st)) {
        if ((options & copy_options::update_existing) == copy_options::update_existing) {
            auto from_time = last_write_time(from, ec);
            if (ec) {
                ec = detail::make_system_error();
                return false;
            }
            auto to_time = last_write_time(to, ec);
            if (ec) {
                ec = detail::make_system_error();
                return false;
            }
            if (from_time <= to_time) {
                return false;
            }
        }
        overwrite = true;
    }
#ifdef GHC_OS_WINDOWS
    if (!::CopyFileW(GHC_NATIVEWP(from), GHC_NATIVEWP(to), !overwrite)) {
        ec = detail::make_system_error();
        return false;
    }
    return true;
#else
    std::vector<char> buffer(16384, '\0');
    int in = -1, out = -1;
    if ((in = ::open(from.c_str(), O_RDONLY)) < 0) {
        ec = detail::make_system_error();
        return false;
    }
    int mode = O_CREAT | O_WRONLY | O_TRUNC;
    if (!overwrite) {
        mode |= O_EXCL;
    }
    if ((out = ::open(to.c_str(), mode, static_cast<int>(sf.permissions() & perms::all))) < 0) {
        ec = detail::make_system_error();
        ::close(in);
        return false;
    }
    ssize_t br, bw;
    while ((br = ::read(in, buffer.data(), buffer.size())) > 0) {
        ssize_t offset = 0;
        do {
            if ((bw = ::write(out, buffer.data() + offset, static_cast<size_t>(br))) > 0) {
                br -= bw;
                offset += bw;
            }
            else if (bw < 0) {
                ec = detail::make_system_error();
                ::close(in);
                ::close(out);
                return false;
            }
        } while (br);
    }
    ::close(in);
    ::close(out);
    return true;
#endif
}